

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  undefined1 *puVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  ImGuiAxis axis;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImDrawList *this;
  ImGuiDockNode *pIVar5;
  long lVar6;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  uint uVar12;
  ImU32 col;
  ImGuiID IVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float cur_size_1;
  ImRect bb;
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  float cur_size_0;
  float local_a0;
  float local_9c;
  ImRect local_98;
  float local_80;
  float local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  ImVector<ImGuiDockNode_*> local_68;
  float local_58 [4];
  undefined1 local_48 [16];
  
  pIVar10 = GImGui;
  node_00 = node->ChildNodes[0];
  if (node_00 != (ImGuiDockNode *)0x0) {
    node_01 = node->ChildNodes[1];
    if (((node_00->field_0xbd & 2) != 0) && ((node_01->field_0xbd & 2) != 0)) {
      axis = node->SplitAxis;
      lVar16 = (long)axis;
      if (lVar16 == -1) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3b29,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      local_98.Min = node_00->Pos;
      local_98.Max = node_01->Pos;
      if (1 < (uint)axis) {
        __assert_fail("idx <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x110,"float &ImVec2::operator[](size_t)");
      }
      (&local_98.Min.x)[lVar16] =
           *(float *)((long)node_00->ChildNodes + lVar16 * 4 + 0x30) + (&local_98.Min.x)[lVar16];
      uVar14 = (ulong)(uint)axis ^ 1;
      (&local_98.Max.x)[uVar14] =
           *(float *)((long)node_01->ChildNodes + uVar14 * 4 + 0x30) + (&local_98.Max.x)[uVar14];
      uVar12 = node_01->MergedFlags | node_00->MergedFlags;
      if (((uVar12 & 0x20) == 0) &&
         ((uVar12 & (uint)((ulong)(uint)axis != 0) * 0x400000 + 0x400000) == 0)) {
        PushID(node->ID);
        local_68.Size = 0;
        local_68.Capacity = 0;
        local_68.Data = (ImGuiDockNode **)0x0;
        local_78._0_4_ = 0.0;
        local_78._4_4_ = 0.0;
        uStack_70 = (ImGuiDockNode **)0x0;
        fVar3 = (&(pIVar10->Style).WindowMinSize.x)[lVar16];
        local_48 = ZEXT416((uint)(*(float *)((long)node->ChildNodes[0]->ChildNodes +
                                            lVar16 * 4 + 0x28) + fVar3));
        fVar17 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar16 * 4 + 0x28);
        fVar4 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar16 * 4 + 0x30);
        IVar13 = ImGuiWindow::GetID(GImGui->CurrentWindow,"##Splitter",(char *)0x0);
        local_a0 = (fVar17 + fVar4) - fVar3;
        if (pIVar10->ActiveId == IVar13) {
          DockNodeTreeUpdateSplitterFindTouchingNode
                    (node_00,axis,1,(ImVector<ImGuiDockNode_*> *)local_78);
          DockNodeTreeUpdateSplitterFindTouchingNode(node_01,axis,0,&local_68);
          if (0 < (long)(int)local_78._0_4_) {
            lVar15 = 0;
            fVar17 = (float)local_48._0_4_;
            do {
              pIVar5 = uStack_70[lVar15];
              local_58[0] = (pIVar5->Pos).x;
              local_58[1] = (pIVar5->Pos).y;
              local_58[2] = (pIVar5->Pos).x + (pIVar5->Size).x;
              local_58[3] = (pIVar5->Pos).y + (pIVar5->Size).y;
              uVar12 = -(uint)(local_58[lVar16] + fVar3 <= fVar17);
              fVar17 = (float)(uVar12 & (uint)fVar17 | ~uVar12 & (uint)(local_58[lVar16] + fVar3));
              local_48 = ZEXT416((uint)fVar17);
              lVar15 = lVar15 + 1;
            } while ((int)local_78._0_4_ != lVar15);
          }
          if (0 < (long)local_68.Size) {
            lVar15 = 0;
            do {
              pIVar5 = local_68.Data[lVar15];
              local_58[0] = (pIVar5->Pos).x;
              local_58[1] = (pIVar5->Pos).y;
              local_58[2] = (pIVar5->Pos).x + (pIVar5->Size).x;
              local_58[3] = (pIVar5->Pos).y + (pIVar5->Size).y;
              if (local_58[lVar16 + 2] - fVar3 <= local_a0) {
                local_a0 = local_58[lVar16 + 2] - fVar3;
              }
              lVar15 = lVar15 + 1;
            } while (local_68.Size != lVar15);
          }
        }
        local_58[0] = *(float *)((long)node_00->ChildNodes + lVar16 * 4 + 0x30);
        local_9c = *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x30);
        local_7c = *(float *)((long)node_00->ChildNodes + lVar16 * 4 + 0x28);
        fVar3 = *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x28);
        local_80 = *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x30);
        IVar13 = ImGuiWindow::GetID(GImGui->CurrentWindow,"##Splitter",(char *)0x0);
        bVar11 = SplitterBehavior(&local_98,IVar13,axis,local_58,&local_9c,
                                  (float)local_48._0_4_ - local_7c,(fVar3 + local_80) - local_a0,4.0
                                  ,0.04);
        if (((bVar11) && (0 < (int)local_78._0_4_)) && (0 < local_68.Size)) {
          *(float *)((long)node_00->ChildNodes + lVar16 * 4 + 0x38) = local_58[0];
          *(float *)((long)node_00->ChildNodes + lVar16 * 4 + 0x30) = local_58[0];
          *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x28) =
               *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x28) -
               (local_9c - *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x30));
          *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x38) = local_9c;
          *(float *)((long)node_01->ChildNodes + lVar16 * 4 + 0x30) = local_9c;
          lVar16 = 0;
          do {
            if (0 < *(int *)(local_78 + lVar16 * 0x10)) {
              lVar15 = 0;
              do {
                lVar6 = *(long *)((&uStack_70)[lVar16 * 2] + lVar15 * 8);
                pIVar5 = *(ImGuiDockNode **)(lVar6 + 0x18);
                while (pIVar5 != node) {
                  if (pIVar5->SplitAxis == axis) {
                    puVar1 = &pIVar5->ChildNodes[lVar16]->field_0xbc;
                    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x8000;
                  }
                  lVar6 = *(long *)(lVar6 + 0x18);
                  pIVar5 = *(ImGuiDockNode **)(lVar6 + 0x18);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)(local_78 + lVar16 * 0x10));
            }
            bVar11 = lVar16 == 0;
            lVar16 = lVar16 + 1;
          } while (bVar11);
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,false);
          DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,false);
          if (GImGui->SettingsDirtyTimer <= 0.0) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
        }
        PopID();
        lVar16 = 0x20;
        do {
          pvVar7 = *(void **)((long)&local_80 + lVar16);
          if (pvVar7 != (void *)0x0) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(pvVar7,GImAllocatorUserData);
          }
          lVar16 = lVar16 + -0x10;
        } while (lVar16 != 0);
      }
      else {
        this = GImGui->CurrentWindow->DrawList;
        local_78._0_4_ = (GImGui->Style).Colors[0x1b].x;
        local_78._4_4_ = (GImGui->Style).Colors[0x1b].y;
        uVar8 = (GImGui->Style).Colors[0x1b].z;
        uVar9 = (GImGui->Style).Colors[0x1b].w;
        uStack_70 = (ImGuiDockNode **)CONCAT44((GImGui->Style).Alpha * (float)uVar9,uVar8);
        col = ColorConvertFloat4ToU32((ImVec4 *)local_78);
        ImDrawList::AddRectFilled
                  (this,&local_98.Min,&local_98.Max,col,(pIVar10->Style).FrameRounding,0);
      }
    }
    if ((node_00->field_0xbd & 2) != 0) {
      DockNodeTreeUpdateSplitter(node_00);
    }
    if ((node_01->field_0xbd & 2) != 0) {
      DockNodeTreeUpdateSplitter(node_01);
    }
  }
  return;
}

Assistant:

const ImWchar* ImStrbolW(const ImWchar* buf_mid_line, const ImWchar* buf_begin) // find beginning-of-line
{
    while (buf_mid_line > buf_begin && buf_mid_line[-1] != '\n')
        buf_mid_line--;
    return buf_mid_line;
}